

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurlNoGrads.cpp
# Opt level: O0

void TPZShapeHCurlNoGrads<pzshape::TPZShapeTriang>::Shape
               (TPZVec<double> *pt,TPZShapeData *data,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *curlphi)

{
  int iVar1;
  int *piVar2;
  double *pdVar3;
  int64_t iVar4;
  long in_RSI;
  double dVar5;
  int x_3;
  int x_2;
  int fi;
  int ifunc;
  int64_t newfuncs;
  TPZVec<int> filtVecShape;
  int x_1;
  int x;
  int fss;
  int ie;
  int fcount;
  TPZFMatrix<double> curlphi_unfilt;
  TPZFMatrix<double> phi_unfilt;
  int i;
  int n_unfilt;
  TPZManVector<int,_4> first_hcurl_side;
  TPZManVector<int,_27> *connectorders;
  int nedges;
  int curldim;
  int dim;
  int ncon;
  int nsides;
  int ncorner;
  TPZManVector<int,_4> *in_stack_fffffffffffffd40;
  double *in_stack_fffffffffffffd50;
  _func_int **in_stack_fffffffffffffd58;
  TPZFMatrix<double> *in_stack_fffffffffffffd60;
  int64_t in_stack_fffffffffffffd68;
  TPZManVector<int,_4> *in_stack_fffffffffffffd70;
  int64_t in_stack_fffffffffffffd78;
  TPZFMatrix<double> *in_stack_fffffffffffffd80;
  TPZFMatrix<double> *in_stack_fffffffffffffd98;
  TPZFMatrix<double> *in_stack_fffffffffffffda0;
  TPZShapeData *in_stack_fffffffffffffda8;
  TPZVec<double> *in_stack_fffffffffffffdb0;
  TPZVec<int> *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  TPZVec<int> *in_stack_fffffffffffffdf0;
  int local_1f8;
  int local_1f4;
  int local_1ec;
  TPZVec<int> local_1e0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  int local_88;
  int local_78;
  undefined4 local_74;
  TPZVec<int> local_70;
  TPZVec<int> *local_40;
  int local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  long local_10;
  
  local_24 = 3;
  local_28 = 7;
  local_2c = 4;
  local_30 = 2;
  local_34 = 1;
  local_10 = in_RSI;
  local_38 = pztopology::TPZTriangle::NumSides(0x18d2678);
  local_40 = (TPZVec<int> *)(local_10 + 0x2b50);
  local_74 = 0;
  TPZManVector<int,_4>::TPZManVector
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,(int *)in_stack_fffffffffffffd60);
  local_78 = 0;
  TPZVec<int>::operator[](local_40,0);
  iVar1 = TPZShapeHCurl<pzshape::TPZShapeTriang>::ComputeNConnectShapeF
                    ((int)in_stack_fffffffffffffd70,(int)((ulong)in_stack_fffffffffffffd68 >> 0x20))
  ;
  local_78 = iVar1 + local_78;
  for (local_88 = 1; local_88 < 4; local_88 = local_88 + 1) {
    in_stack_fffffffffffffdec = local_78;
    in_stack_fffffffffffffdf0 = (TPZVec<int> *)TPZVec<int>::operator[](&local_70,(long)local_88);
    *(int *)&in_stack_fffffffffffffdf0->_vptr_TPZVec = in_stack_fffffffffffffdec;
    in_stack_fffffffffffffde0 = (TPZVec<int> *)TPZVec<int>::operator[](local_40,(long)local_88);
    iVar1 = TPZShapeHCurl<pzshape::TPZShapeTriang>::ComputeNConnectShapeF
                      ((int)in_stack_fffffffffffffd70,
                       (int)((ulong)in_stack_fffffffffffffd68 >> 0x20));
    local_78 = iVar1 + local_78;
  }
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,(int64_t)in_stack_fffffffffffffd70)
  ;
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,(int64_t)in_stack_fffffffffffffd70)
  ;
  TPZShapeHCurl<pzshape::TPZShapeTriang>::Shape
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
             in_stack_fffffffffffffd98);
  local_1ac = 0;
  for (local_1b0 = 0; local_1b0 < local_38; local_1b0 = local_1b0 + 1) {
    piVar2 = TPZVec<int>::operator[](&local_70,(long)local_1b0);
    local_1b4 = *piVar2;
    for (local_1b8 = 0; local_1b8 < 2; local_1b8 = local_1b8 + 1) {
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      dVar5 = *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      dVar5 = dVar5 + *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      *pdVar3 = dVar5;
    }
    for (local_1bc = 0; local_1bc < 1; local_1bc = local_1bc + 1) {
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      dVar5 = *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      dVar5 = dVar5 + *pdVar3;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      *pdVar3 = dVar5;
    }
    local_1ac = local_1ac + 1;
  }
  TPZVec<int>::TPZVec(&local_1e0);
  HighOrderFunctionsFilter
            (in_stack_fffffffffffffdf0,
             (TPZVec<int> *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
             in_stack_fffffffffffffde0);
  iVar4 = TPZVec<int>::size(&local_1e0);
  for (local_1ec = 0; local_1ec < iVar4; local_1ec = local_1ec + 1) {
    TPZVec<int>::operator[](&local_1e0,(long)local_1ec);
    for (local_1f4 = 0; local_1f4 < 1; local_1f4 = local_1f4 + 1) {
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      in_stack_fffffffffffffd58 = (_func_int **)*pdVar3;
      in_stack_fffffffffffffd60 =
           (TPZFMatrix<double> *)
           TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                      (int64_t)in_stack_fffffffffffffd50);
      (in_stack_fffffffffffffd60->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable = in_stack_fffffffffffffd58;
    }
    for (local_1f8 = 0; local_1f8 < 2; local_1f8 = local_1f8 + 1) {
      in_stack_fffffffffffffd50 =
           TPZFMatrix<double>::operator()
                     (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                      (int64_t)in_stack_fffffffffffffd50);
      in_stack_fffffffffffffd40 = (TPZManVector<int,_4> *)*in_stack_fffffffffffffd50;
      pdVar3 = TPZFMatrix<double>::operator()
                         (in_stack_fffffffffffffd60,(int64_t)in_stack_fffffffffffffd58,
                          (int64_t)in_stack_fffffffffffffd50);
      *pdVar3 = (double)in_stack_fffffffffffffd40;
    }
    local_1ac = local_1ac + 1;
  }
  TPZVec<int>::~TPZVec(&in_stack_fffffffffffffd40->super_TPZVec<int>);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x18d2ce8);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x18d2cf5);
  TPZManVector<int,_4>::~TPZManVector(in_stack_fffffffffffffd40);
  return;
}

Assistant:

void TPZShapeHCurlNoGrads<TSHAPE>::Shape(TPZVec<REAL> &pt, TPZShapeData &data, TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &curlphi)
{

    constexpr int ncorner = TSHAPE::NCornerNodes;
    constexpr int nsides = TSHAPE::NSides;
    constexpr int ncon = nsides - ncorner;
    constexpr int dim = TSHAPE::Dimension;
    constexpr int curldim = [dim](){
        if constexpr (dim == 1) return 1;
        else{
            return 2*dim - 3;//1 for 2D 3 for 3D
        }
    }();
    const int nedges = TSHAPE::NumSides(1);
    
    //calculates # of unfiltered hcurl functions
    const auto &connectorders = data.fHDivConnectOrders;
    //first_hcurl_side[i] is the index of the first shape function associated with side i
    TPZManVector<int,ncon> first_hcurl_side(ncon,0);
    //total number of unfiltered funcs
    int n_unfilt = 0;

    {
      n_unfilt += TPZShapeHCurl<TSHAPE>::ComputeNConnectShapeF(0,connectorders[0]);
      for (int i = 1; i < ncon; i++){
        first_hcurl_side[i] = n_unfilt;
        n_unfilt += TPZShapeHCurl<TSHAPE>::ComputeNConnectShapeF(i,connectorders[i]);
      }
    }
    
    //computes  unfiltered hcurl funcs
    TPZFMatrix<REAL> phi_unfilt(dim,n_unfilt), curlphi_unfilt(curldim,n_unfilt);
    TPZShapeHCurl<TSHAPE>::Shape(pt, data, phi_unfilt, curlphi_unfilt);

    //now we filter the functions
    int fcount = 0;
    //edges: we sum the lowest order functions on the edge
    for(auto ie = 0; ie < nedges; ie++){
      //fss = first side shape
      const auto fss = first_hcurl_side[ie];
      for(auto x = 0; x < dim; x++){
        phi(x,fcount) = phi_unfilt(x,fss) + phi_unfilt(x,fss+1);
      }
      for(auto x = 0; x < curldim; x++){
        curlphi(x,fcount) = curlphi_unfilt(x,fss) + curlphi_unfilt(x,fss+1);
      }
      fcount++;
    }
    if constexpr (dim < 2) return;

    TPZVec<int> filtVecShape;
    HighOrderFunctionsFilter(first_hcurl_side, connectorders,filtVecShape);

    const auto newfuncs = filtVecShape.size();
    
    for(int ifunc = 0; ifunc < newfuncs; ifunc++){
      const auto fi = filtVecShape[ifunc];
      for(auto x = 0; x < curldim; x++){
        curlphi(x,fcount) = curlphi_unfilt(x,fi);
      }
      for(auto x = 0; x < dim; x++){
        phi(x,fcount) = phi_unfilt(x,fi);
      }
      fcount++;
    } 
    
    
}